

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,big_decimal_fp *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  uint uVar1;
  undefined1 uVar2;
  basic_appender<char> bVar3;
  ulong uVar4;
  undefined8 uVar5;
  int **ppiVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  undefined8 uVar11;
  uint uVar12;
  long lVar13;
  size_t sVar14;
  buffer<char> *buf;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  int exp;
  char *significand;
  anon_class_40_8_fd1bf2f9 write;
  int num_zeros;
  undefined1 local_da [2];
  undefined8 local_d8;
  undefined8 local_d0;
  basic_appender<char> local_c8;
  undefined1 local_c0 [8];
  undefined1 local_b8 [20];
  undefined1 auStack_a4 [20];
  format_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int *local_60;
  long local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_c0 = (undefined1  [8])f->significand;
  local_d8._4_4_ = f->significand_size;
  uVar4 = (ulong)((local_d8._4_4_ + 1) - (uint)(s == none));
  local_da[1] = '0';
  local_da[0] = '.';
  local_d0._0_4_ = s;
  local_c8.container = out.container;
  if (((specs->super_basic_specs).data_ & 0x4000) != 0) {
    local_da[0] = decimal_point_impl<char>(loc);
  }
  uVar5 = auStack_a4._4_8_;
  bVar3.container = local_c8.container;
  uVar12 = f->exponent;
  local_d0._4_4_ = local_d8._4_4_ + uVar12;
  uVar1 = (specs->super_basic_specs).data_;
  iVar9 = specs->precision;
  bVar7 = (byte)uVar1 & 7;
  if (bVar7 != 1) {
    if ((uVar1 & 7) == 2) {
LAB_0029f662:
      if ((int)uVar12 < 0) {
        if (local_d0._4_4_ < 1) {
          local_70._M_allocated_capacity._0_4_ = -local_d0._4_4_;
          if ((local_d8._4_4_ == 0) &&
             (SBORROW4(iVar9,-local_d0._4_4_) != iVar9 + local_d0._4_4_ < 0 && -1 < iVar9)) {
            local_70._M_allocated_capacity._0_4_ = iVar9;
          }
          uVar12 = 1;
          if (local_d8._4_4_ == 0 && local_70._0_4_ == 0) {
            uVar12 = uVar1 >> 0xd & 1;
          }
          local_b8._8_8_ = &local_d8;
          local_d8._0_1_ = (char)uVar12;
          sVar14 = (local_70._0_4_ + uVar12 + 1) + uVar4;
          local_b8._0_8_ = &local_d0;
          unique0x00004e80 = local_da;
          auStack_a4._4_8_ = &local_70;
          auStack_a4._12_8_ = local_da + 1;
          local_90 = (format_specs *)local_c0;
          local_88._M_allocated_capacity = (long)&local_d8 + 4;
          bVar3 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                            (local_c8,specs,sVar14,sVar14,(anon_class_56_7_88befd79 *)local_b8);
          return (basic_appender<char>)bVar3.container;
        }
        uVar12 = iVar9 - local_d8._4_4_ & (int)(uVar1 << 0x12) >> 0x1f;
        local_d8._0_4_ = uVar12;
        digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                  ((digit_grouping<char> *)local_b8,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
        iVar9 = 0;
        if ((int)uVar12 < 1) {
          uVar12 = 0;
        }
        sVar14 = uVar12 + uVar4;
        ppiVar6 = (int **)local_b8._0_8_;
        do {
          iVar8 = 0x7fffffff;
          if (local_90 != (format_specs *)0x0) {
            if (ppiVar6 == (int **)(local_b8._8_8_ + local_b8._0_8_)) {
              uVar12 = (uint)(char)*(byte *)((long)(local_b8._8_8_ + local_b8._0_8_) + -1);
            }
            else {
              bVar7 = *(byte *)ppiVar6;
              if ((byte)(bVar7 + 0x81) < 0x82) goto LAB_0029f9e6;
              ppiVar6 = (int **)((long)ppiVar6 + 1);
              uVar12 = (uint)bVar7;
            }
            iVar9 = iVar9 + uVar12;
            iVar8 = iVar9;
          }
LAB_0029f9e6:
          sVar14 = sVar14 + 1;
        } while (iVar8 < local_d0._4_4_);
        local_70._M_allocated_capacity = (size_type)&local_d0;
        local_70._8_8_ = local_c0;
        local_60 = (int *)((long)&local_d8 + 4);
        local_58 = (long)&local_d0 + 4;
        local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_da;
        local_40._M_allocated_capacity = (size_type)&local_d8;
        local_40._8_8_ = local_da + 1;
        local_48 = (digit_grouping<char> *)local_b8;
        bVar3 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                          (local_c8,specs,sVar14,sVar14,(anon_class_64_8_085c650e *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)auStack_a4._12_8_ != &local_88) {
          operator_delete((void *)auStack_a4._12_8_,(ulong)(local_88._M_allocated_capacity + 1));
        }
        uVar5 = stack0xffffffffffffff58;
        uVar11 = local_b8._0_8_;
        if ((undefined1 *)local_b8._0_8_ == local_b8 + 0x10) {
          return (basic_appender<char>)bVar3.container;
        }
      }
      else {
        lVar13 = uVar12 + uVar4;
        local_d8._0_4_ = iVar9 - local_d0._4_4_;
        if ((uVar1 >> 0xd & 1) != 0) {
          if (bVar7 != 2 && (int)(undefined4)local_d8 < 1) {
            local_d8._0_4_ = 0;
          }
          lVar13 = lVar13 + 1;
          if (0 < (long)(int)(undefined4)local_d8) {
            lVar13 = lVar13 + (int)(undefined4)local_d8;
          }
        }
        digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                  ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
        sVar14 = lVar13 - 1;
        iVar9 = 0;
        uVar5 = local_70._0_8_;
        do {
          iVar8 = 0x7fffffff;
          if (local_48 != (digit_grouping<char> *)0x0) {
            if ((int **)uVar5 == (int **)(local_70._8_8_ + local_70._0_8_)) {
              uVar12 = (uint)(char)*(byte *)((long)(local_70._8_8_ + local_70._0_8_) + -1);
            }
            else {
              bVar7 = *(byte *)uVar5;
              if ((byte)(bVar7 + 0x81) < 0x82) goto LAB_0029f8bc;
              uVar5 = uVar5 + 1;
              uVar12 = (uint)bVar7;
            }
            iVar9 = iVar9 + uVar12;
            iVar8 = iVar9;
          }
LAB_0029f8bc:
          sVar14 = sVar14 + 1;
        } while (iVar8 < local_d0._4_4_);
        local_b8._0_8_ = &local_d0;
        local_b8._8_8_ = local_c0;
        unique0x00004e80 = (long)&local_d8 + 4;
        local_88._M_allocated_capacity = (size_type)local_da;
        local_88._8_8_ = &local_d8;
        local_78 = local_da + 1;
        auStack_a4._4_8_ = f;
        auStack_a4._12_8_ = &local_70;
        local_90 = specs;
        bVar3 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                          (local_c8,specs,sVar14,sVar14,(anon_class_72_9_eb40e20e *)local_b8);
        if (local_50 != &local_40) {
          operator_delete(local_50,local_40._M_allocated_capacity + 1);
        }
        uVar5 = local_60;
        uVar11 = local_70._0_8_;
        if ((int **)local_70._0_8_ == &local_60) {
          return (basic_appender<char>)bVar3.container;
        }
      }
      operator_delete((void *)uVar11,uVar5 + 1);
      return (basic_appender<char>)bVar3.container;
    }
    if (-4 < local_d0._4_4_) {
      if (0 < iVar9) {
        exp_upper = iVar9;
      }
      if (local_d0._4_4_ <= exp_upper) goto LAB_0029f662;
    }
  }
  iVar8 = local_d8._4_4_ + uVar12 + -1;
  if ((uVar1 >> 0xd & 1) == 0) {
    uVar10 = 0;
    if (local_d8._4_4_ == 1) {
      local_da[0] = '\0';
    }
  }
  else {
    uVar10 = 0;
    if (0 < iVar9 - local_d8._4_4_) {
      uVar10 = (ulong)(uint)(iVar9 - local_d8._4_4_);
    }
    uVar4 = uVar4 + uVar10;
  }
  iVar9 = 1 - local_d0._4_4_;
  if (0 < local_d0._4_4_) {
    iVar9 = iVar8;
  }
  lVar13 = 2;
  if (99 < iVar9) {
    lVar13 = (ulong)(999 < iVar9) + 3;
  }
  sVar14 = (3 - (ulong)(local_da[0] == '\0')) + uVar4 + lVar13;
  local_b8._0_4_ = (undefined4)local_d0;
  local_b8._8_8_ = local_c0;
  auStack_a4[0] = local_da[0];
  local_b8._16_4_ = local_d8._4_4_;
  auStack_a4._4_5_ = CONCAT14('0',(int)uVar10);
  auStack_a4._10_2_ = SUB82(uVar5,6);
  auStack_a4._4_8_ =
       CONCAT26(auStack_a4._10_2_,CONCAT15(((uVar1 >> 0xc & 1) == 0) << 5,auStack_a4._4_5_)) |
       0x450000000000;
  auStack_a4._12_4_ = iVar8;
  if (specs->width < 1) {
    uVar4 = sVar14 + (local_c8.container)->size_;
    if ((local_c8.container)->capacity_ < uVar4) {
      (*(local_c8.container)->grow_)(local_c8.container,uVar4);
    }
    if (local_b8._0_4_ != none) {
      iVar9 = local_b8._0_4_ << 3;
      uVar4 = (bVar3.container)->size_ + 1;
      if ((bVar3.container)->capacity_ < uVar4) {
        (*(bVar3.container)->grow_)(bVar3.container,uVar4);
      }
      sVar14 = (bVar3.container)->size_;
      (bVar3.container)->size_ = sVar14 + 1;
      (bVar3.container)->ptr_[sVar14] = (char)(0x202b2d00 >> ((byte)iVar9 & 0x1f));
    }
    bVar3 = write_significand<fmt::v11::basic_appender<char>,char>
                      (bVar3,(char *)local_b8._8_8_,local_b8._16_4_,1,auStack_a4[0]);
    if (0 < (int)auStack_a4._4_4_) {
      bVar3 = fill_n<fmt::v11::basic_appender<char>,int,char>(bVar3,auStack_a4._4_4_,auStack_a4 + 8)
      ;
    }
    uVar2 = auStack_a4[9];
    uVar4 = (bVar3.container)->size_ + 1;
    if ((bVar3.container)->capacity_ < uVar4) {
      (*(bVar3.container)->grow_)(bVar3.container,uVar4);
    }
    sVar14 = (bVar3.container)->size_;
    (bVar3.container)->size_ = sVar14 + 1;
    (bVar3.container)->ptr_[sVar14] = uVar2;
    bVar3 = write_exponent<char,fmt::v11::basic_appender<char>>(auStack_a4._12_4_,bVar3);
  }
  else {
    bVar3 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      (local_c8,specs,sVar14,sVar14,(anon_class_40_8_fd1bf2f9 *)local_b8);
  }
  return (basic_appender<char>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}